

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_shared.cpp
# Opt level: O3

void KokkosTools::KernelTimer::increment_counter_region(char *name,KernelExecutionType kType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  mapped_type *ppKVar3;
  mapped_type pKVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  timeval now;
  string nameStr;
  allocator<char> local_89;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
  local_88;
  key_type local_60;
  pointer local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,name,(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,name,&local_89);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_,&local_88.first);
  paVar1 = &local_88.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.first._M_dataplus._M_p,local_88.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (iVar2._M_node == (_Base_ptr)(count_map_abi_cxx11_ + 8)) {
    pKVar4 = (mapped_type)operator_new(0x48);
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    paVar5 = &(pKVar4->kernelName).field_2;
    (pKVar4->kernelName)._M_dataplus._M_p = (pointer)paVar5;
    if (local_40 == &local_30) {
      paVar5->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
      *(undefined8 *)((long)&(pKVar4->kernelName).field_2 + 8) = uStack_28;
    }
    else {
      (pKVar4->kernelName)._M_dataplus._M_p = local_40;
      (pKVar4->kernelName).field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    }
    (pKVar4->kernelName)._M_string_length = local_38;
    local_38 = 0;
    local_30 = '\0';
    pKVar4->timeSq = 0.0;
    pKVar4->startTime = 0.0;
    pKVar4->callCount = 0;
    pKVar4->time = 0.0;
    pKVar4->kType = kType;
    local_88.first._M_dataplus._M_p = (pointer)paVar1;
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    local_88.second = pKVar4;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,KokkosTools::KernelTimer::KernelPerformanceInfo*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
                *)count_map_abi_cxx11_,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.first._M_dataplus._M_p,
                      local_88.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ppKVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                            *)count_map_abi_cxx11_,&local_60);
    pKVar4 = *ppKVar3;
  }
  (&regions)[current_region_level] = pKVar4;
  gettimeofday((timeval *)&local_88,(__timezone_ptr_t)0x0);
  pKVar4->startTime =
       (double)(long)local_88.first._M_string_length * 1e-06 +
       (double)(long)local_88.first._M_dataplus._M_p;
  current_region_level = current_region_level + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void increment_counter_region(const char* name, KernelExecutionType kType) {
  std::string nameStr(name);

  if (count_map.find(name) == count_map.end()) {
    KernelPerformanceInfo* info = new KernelPerformanceInfo(nameStr, kType);
    count_map.insert(
        std::pair<std::string, KernelPerformanceInfo*>(nameStr, info));

    regions[current_region_level] = info;
  } else {
    regions[current_region_level] = count_map[nameStr];
  }

  regions[current_region_level]->startTimer();
  current_region_level++;
}